

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

QMap<int,_QVariant> __thiscall QStandardItemPrivate::itemData(QStandardItemPrivate *this)

{
  long in_RSI;
  QStandardItemData *data;
  int *key;
  long lVar1;
  
  this->model = (QStandardItemModel *)0x0;
  if (*(long *)(in_RSI + 0x20) != 0) {
    key = *(int **)(in_RSI + 0x18);
    lVar1 = *(long *)(in_RSI + 0x20) * 0x28;
    do {
      if (*key != 0xff) {
        QMap<int,_QVariant>::insert((QMap<int,_QVariant> *)this,key,(QVariant *)(key + 2));
      }
      key = key + 10;
      lVar1 = lVar1 + -0x28;
    } while (lVar1 != 0);
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
}

Assistant:

QMap<int, QVariant> QStandardItemPrivate::itemData() const
{
    QMap<int, QVariant> result;
    for (const auto &data : values) {
        if (data.role != DataFlagsRole)
            result.insert(data.role, data.value);
    }
    return result;
}